

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::detail::ReferenceResolver::store_anchors_and_refs(ReferenceResolver *this)

{
  refdata *prVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  sVar2 = Tree::root_id(this->t);
  sVar2 = count_anchors_and_refs(this,sVar2);
  if (sVar2 != 0) {
    stack<c4::yml::detail::ReferenceResolver::refdata,_16UL>::reserve(&this->refs,sVar2);
    sVar2 = Tree::root_id(this->t);
    _store_anchors_and_refs(this,sVar2);
    sVar2 = (this->refs).m_size;
    if (sVar2 != 0) {
      prVar1 = (this->refs).m_stack;
      lVar3 = -1;
      lVar4 = 0;
      lVar5 = 0;
      do {
        *(long *)((long)&prVar1->prev_anchor + lVar4) = lVar3;
        if ((*(byte *)((long)&(prVar1->type).type + lVar4 + 1) & 3) != 0) {
          lVar3 = lVar5;
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x30;
      } while (sVar2 * 0x30 != lVar4);
    }
  }
  return;
}

Assistant:

void store_anchors_and_refs()
    {
        // minimize (re-)allocations by counting first
        size_t num_anchors_and_refs = count_anchors_and_refs(t->root_id());
        if(!num_anchors_and_refs)
            return;
        refs.reserve(num_anchors_and_refs);

        // now descend through the hierarchy
        _store_anchors_and_refs(t->root_id());

        // finally connect the reference list
        size_t prev_anchor = npos;
        size_t count = 0;
        for(auto &rd : refs)
        {
            rd.prev_anchor = prev_anchor;
            if(rd.type.is_anchor())
                prev_anchor = count;
            ++count;
        }
    }